

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getAverageVelocityJacobian
          (KinDynComputations *this,MatrixView<double> *avgVelocityJacobian)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_248;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_> local_228;
  MatrixView<double> local_200;
  MatrixView<double> local_1d0;
  Matrix6x6 *local_1a0 [2];
  PointerType local_190;
  variable_if_dynamic<long,__1> local_188;
  variable_if_dynamic<long,__1> local_180;
  PointerType local_178;
  variable_if_dynamic<long,__1> vStack_170;
  variable_if_dynamic<long,__1> local_168;
  variable_if_dynamic<long,__1> local_158;
  variable_if_dynamic<long,__1> vStack_150;
  long local_148;
  Matrix6x6 invLockedInertia;
  
  if ((avgVelocityJacobian->m_rows == 6) &&
     (lVar3 = avgVelocityJacobian->m_cols, lVar2 = iDynTree::Model::getNrOfDOFs(),
     lVar3 == lVar2 + 6)) {
    computeRawMassMatrixAndTotalMomentum(this);
    KinDynComputationsPrivateAttributes::getRobotLockedInertia(this->pimpl);
    iDynTree::SpatialInertia::getInverse();
    toEigen(&local_248,(MatrixDynSize *)&this->pimpl->m_rawMassMatrix);
    lVar3 = iDynTree::Model::getNrOfDOFs();
    local_180.m_value = lVar3 + 6;
    local_178 = local_248.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    vStack_170.m_value =
         local_248.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    local_190 = local_248.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    local_188.m_value = 6;
    local_168.m_value =
         local_248.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    local_158.m_value = 0;
    vStack_150.m_value = 0;
    local_148 = local_248.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value;
    local_228.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
    .
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
    .m_cols.m_value = avgVelocityJacobian->m_cols;
    local_228.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
    .
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
    .m_data = avgVelocityJacobian->m_storage;
    local_228.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
    .
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
    .m_rows.m_value = avgVelocityJacobian->m_rows;
    local_228.m_stride.m_outer.m_value = 1;
    local_228.m_stride.m_inner.m_value =
         local_228.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
         .m_rows.m_value;
    if (avgVelocityJacobian->m_storageOrder != ColumnMajor) {
      local_228.m_stride.m_outer.m_value =
           local_228.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
           .m_cols.m_value;
      local_228.m_stride.m_inner.m_value = 1;
    }
    local_1a0[0] = &invLockedInertia;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,0>>
              (&local_228,
               (Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                *)local_1a0);
    local_1d0.m_storage = avgVelocityJacobian->m_storage;
    local_1d0.m_rows = avgVelocityJacobian->m_rows;
    local_1d0.m_cols = avgVelocityJacobian->m_cols;
    local_1d0.m_storageOrder = avgVelocityJacobian->m_storageOrder;
    local_1d0.m_innerStride = avgVelocityJacobian->m_innerStride;
    local_1d0.m_outerStride = avgVelocityJacobian->m_outerStride;
    KinDynComputationsPrivateAttributes::processOnRightSideMatrixExpectingBodyFixedModelVelocity
              (this->pimpl,&local_1d0);
    local_200.m_storage = avgVelocityJacobian->m_storage;
    local_200.m_rows = avgVelocityJacobian->m_rows;
    local_200.m_cols = avgVelocityJacobian->m_cols;
    local_200.m_storageOrder = avgVelocityJacobian->m_storageOrder;
    local_200.m_innerStride = avgVelocityJacobian->m_innerStride;
    local_200.m_outerStride = avgVelocityJacobian->m_outerStride;
    KinDynComputationsPrivateAttributes::processOnLeftSideBodyFixedAvgVelocityJacobian
              (this->pimpl,&local_200);
    bVar1 = true;
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getAverageVelocityJacobian",
               "Wrong size in input avgVelocityJacobian");
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool KinDynComputations::getAverageVelocityJacobian(MatrixView<double> avgVelocityJacobian)
{
    bool ok = (avgVelocityJacobian.rows() == 6)
        && (avgVelocityJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

    if( !ok )
    {
        reportError("KinDynComputations",
                    "getAverageVelocityJacobian",
                    "Wrong size in input avgVelocityJacobian");
        return false;
    }

    this->computeRawMassMatrixAndTotalMomentum();

    const SpatialInertia & lockedInertia = pimpl->getRobotLockedInertia();
    Matrix6x6 invLockedInertia = lockedInertia.getInverse();

    // The first six rows of the mass matrix are the base-base average velocity jacobian
    toEigen(avgVelocityJacobian) = toEigen(invLockedInertia)*toEigen(pimpl->m_rawMassMatrix).block(0,0,6,6+pimpl->m_robot_model.getNrOfDOFs());

    // Handle the different representations
    pimpl->processOnRightSideMatrixExpectingBodyFixedModelVelocity(avgVelocityJacobian);
    pimpl->processOnLeftSideBodyFixedAvgVelocityJacobian(avgVelocityJacobian);

    return true;
}